

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort.cpp
# Opt level: O2

void burstsort_sampling_vector_block(uchar **strings,size_t n)

{
  _WordT *p_Var1;
  byte bVar2;
  vector_block<unsigned_char_*,_128U> *pvVar3;
  TrieNode<unsigned_char> *pTVar4;
  _func_void_uchar_ptr_ptr_int_int *small_sort;
  ulong uVar5;
  size_t depth;
  TrieNode<unsigned_char> *pTVar6;
  BurstSimple<unsigned_char> local_61;
  TrieNode<unsigned_char> *local_60;
  uchar **local_58;
  vector_block<unsigned_char_*,_128U> *local_50;
  uchar *str;
  _func_void_uchar_ptr_ptr_int_int *local_40;
  _func_void_uchar_ptr_ptr_int_int *local_38;
  
  local_58 = strings;
  local_40 = (_func_void_uchar_ptr_ptr_int_int *)n;
  local_60 = pseudo_sample<unsigned_char>(strings,n);
  small_sort = (_func_void_uchar_ptr_ptr_int_int *)0x0;
  do {
    if (small_sort == local_40) {
      traverse<vector_block<unsigned_char*,128u>,void(*)(unsigned_char**,int,int),unsigned_char>
                (local_60,local_58,0,small_sort);
      return;
    }
    str = local_58[(long)small_sort];
    local_38 = small_sort;
    bVar2 = get_char<unsigned_char>(str,0);
    depth = 1;
    pTVar6 = local_60;
    while( true ) {
      uVar5 = (ulong)bVar2;
      if (((pTVar6->is_trie).super__Base_bitset<4UL>._M_w[bVar2 >> 6] >> (uVar5 & 0x3f) & 1) == 0)
      break;
      if (uVar5 == 0) {
        __assert_fail("not is_end(c)",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort.cpp"
                      ,0xdf,
                      "void insert(TrieNode<CharT> *, unsigned char **, size_t) [Threshold = 16000U, BucketT = vector_block<unsigned char *, 128>, BurstImpl = BurstSimple<unsigned char>, CharT = unsigned char]"
                     );
      }
      pTVar6 = (TrieNode<unsigned_char> *)(pTVar6->buckets)._M_elems[uVar5];
      bVar2 = get_char<unsigned_char>(str,depth);
      depth = depth + 1;
    }
    pvVar3 = (vector_block<unsigned_char_*,_128U> *)(pTVar6->buckets)._M_elems[uVar5];
    if (pvVar3 == (vector_block<unsigned_char_*,_128U> *)0x0) {
      pvVar3 = (vector_block<unsigned_char_*,_128U> *)operator_new(0x28);
      (pvVar3->_index_block).super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pvVar3->_index_block).super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (pvVar3->_index_block).super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pvVar3->_insertpos = (uchar **)0x0;
      pvVar3->_left_in_block = 0;
      (pTVar6->buckets)._M_elems[uVar5] = pvVar3;
    }
    local_50 = pvVar3;
    vector_block<unsigned_char_*,_128U>::push_back(pvVar3,&str);
    if ((uVar5 != 0) &&
       (16000 < ((long)(local_50->_index_block).
                       super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                (long)(local_50->_index_block).
                      super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                      _M_impl.super__Vector_impl_data._M_start) * 0x10 -
                (ulong)local_50->_left_in_block)) {
      pTVar4 = BurstSimple<unsigned_char>::operator()(&local_61,local_50,depth);
      pvVar3 = local_50;
      (pTVar6->buckets)._M_elems[uVar5] = pTVar4;
      p_Var1 = (pTVar6->is_trie).super__Base_bitset<4UL>._M_w + (bVar2 >> 6);
      *p_Var1 = *p_Var1 | 1L << (bVar2 & 0x3f);
      vector_block<unsigned_char_*,_128U>::~vector_block(local_50);
      operator_delete(pvVar3);
    }
    small_sort = local_38 + 1;
  } while( true );
}

Assistant:

void burstsort_sampling_vector_block(unsigned char** strings, size_t n)
{
	typedef unsigned char CharT;
	typedef vector_block<unsigned char*, 128> BucketT;
	typedef BurstSimple<CharT> BurstImpl;
	//typedef BurstRecursive<CharT> BurstImpl;
	TrieNode<CharT>* root = pseudo_sample<CharT>(strings, n);
	insert<16000, BucketT, BurstImpl>(root, strings, n);
	traverse<BucketT>(root, strings, 0, SmallSort);
}